

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O0

FStateLabel *
BinarySearch<FStateLabel,FName>
          (FStateLabel *first,int max,offset_in_FStateLabel_to_unknown keyptr,FName *key)

{
  bool bVar1;
  int iVar2;
  FName *this;
  FName *seekey;
  FStateLabel *probe;
  int mid;
  int min;
  FName *key_local;
  offset_in_FStateLabel_to_unknown keyptr_local;
  int max_local;
  FStateLabel *first_local;
  
  probe._4_4_ = 0;
  keyptr_local._4_4_ = max + -1;
  while( true ) {
    if (keyptr_local._4_4_ < probe._4_4_) {
      return (FStateLabel *)0x0;
    }
    iVar2 = (probe._4_4_ + keyptr_local._4_4_) / 2;
    this = (FName *)((long)&first[iVar2].Label.Index + keyptr);
    bVar1 = FName::operator==(this,key);
    if (bVar1) break;
    bVar1 = FName::operator<(this,key);
    if (bVar1) {
      probe._4_4_ = iVar2 + 1;
    }
    else {
      keyptr_local._4_4_ = iVar2 + -1;
    }
  }
  return first + iVar2;
}

Assistant:

inline
const ClassType *BinarySearch (const ClassType *first, int max,
	const KeyType ClassType::*keyptr, const KeyType key)
{
	int min = 0;
	--max;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		const ClassType *probe = &first[mid];
		const KeyType &seekey = probe->*keyptr;
		if (seekey == key)
		{
			return probe;
		}
		else if (seekey < key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}